

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O3

void embree::avx512::
     BVHNIntersector1<8,_16777232,_true,_embree::avx512::ArrayIntersector1<embree::avx512::TriangleMiMBIntersector1Pluecker<4,_true>_>_>
     ::intersect(Intersectors *This,RayHit *ray,RayQueryContext *context)

{
  float *pfVar1;
  undefined8 *puVar2;
  anon_union_16_2_47237d3f_for_Vec3fx_0 aVar3;
  undefined1 auVar4 [16];
  Geometry *pGVar5;
  bool bVar6;
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined8 uVar9;
  undefined8 uVar10;
  undefined1 auVar11 [16];
  byte bVar12;
  uint uVar13;
  AABBNodeMB4D *node1;
  undefined1 (*pauVar14) [32];
  long lVar15;
  byte bVar16;
  byte bVar17;
  uint uVar18;
  long lVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  ulong uVar23;
  long lVar24;
  ulong uVar25;
  ulong uVar26;
  ulong uVar27;
  Scene *pSVar28;
  ulong uVar29;
  uint uVar30;
  ulong uVar31;
  ulong uVar32;
  ulong uVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  float fVar68;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [64];
  undefined1 auVar74 [64];
  undefined4 uVar75;
  float fVar76;
  undefined1 auVar77 [16];
  undefined1 auVar78 [32];
  undefined8 uVar79;
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  float fVar84;
  float fVar85;
  float fVar86;
  float fVar87;
  float fVar88;
  float fVar89;
  undefined1 auVar90 [16];
  undefined1 auVar91 [64];
  undefined1 auVar92 [64];
  float fVar93;
  float fVar94;
  float fVar95;
  float fVar96;
  float fVar97;
  float fVar98;
  undefined1 auVar99 [64];
  undefined1 auVar100 [64];
  undefined1 auVar101 [64];
  undefined1 auVar102 [64];
  undefined1 auVar103 [64];
  undefined1 in_ZMM27 [64];
  undefined1 auVar104 [64];
  undefined1 auVar105 [64];
  undefined1 auVar106 [64];
  undefined1 auVar107 [64];
  undefined1 auVar108 [64];
  UVIdentity<4> mapUV;
  Scene *scene;
  RTCFilterFunctionNArguments args;
  HitK<1> h;
  StackItemT<embree::NodeRefPtr<8>_> stack [564];
  undefined1 local_2659;
  Geometry *local_2658;
  RayHit *local_2650;
  RayQueryContext *local_2648;
  RTCIntersectArguments *local_2640;
  ulong local_2638;
  ulong local_2630;
  Scene *local_2628;
  int local_261c;
  undefined1 local_2618 [16];
  undefined1 local_2608 [16];
  long local_25f8;
  ulong *local_25f0;
  long local_25e8;
  long local_25e0;
  RTCFilterFunctionNArguments local_25d8;
  float local_25a8;
  undefined4 local_25a4;
  undefined4 local_25a0;
  undefined4 local_259c;
  undefined4 local_2598;
  undefined4 local_2594;
  uint local_2590;
  uint local_258c;
  uint local_2588;
  undefined8 local_2578;
  undefined8 uStack_2570;
  undefined1 local_2568 [32];
  undefined1 local_2548 [32];
  undefined1 local_2528 [32];
  undefined1 local_2508 [16];
  undefined1 local_24f8 [16];
  undefined1 local_24e8 [16];
  undefined1 *local_24d8;
  byte local_24d0;
  undefined1 local_24c8 [16];
  undefined1 local_24b8 [16];
  undefined1 local_24a8 [16];
  undefined1 local_2498 [16];
  undefined1 local_2488 [16];
  float local_2478 [4];
  undefined8 local_2468;
  undefined8 uStack_2460;
  undefined1 local_2458 [32];
  undefined1 local_2438 [32];
  undefined1 local_2418 [32];
  float local_23f8;
  float fStack_23f4;
  float fStack_23f0;
  float fStack_23ec;
  float fStack_23e8;
  float fStack_23e4;
  float fStack_23e0;
  float fStack_23dc;
  undefined1 local_23d8 [32];
  undefined1 local_23b8 [32];
  float local_2398;
  float fStack_2394;
  float fStack_2390;
  float fStack_238c;
  float fStack_2388;
  float fStack_2384;
  float fStack_2380;
  float fStack_237c;
  ulong local_2378;
  undefined4 local_2370 [2];
  ulong local_2368 [1127];
  undefined1 auVar63 [32];
  
  local_2378 = *(ulong *)&This->ptr[1].bounds.bounds0.lower.field_0;
  if (local_2378 != 8) {
    local_25f0 = local_2368;
    aVar3 = (ray->super_RayK<1>).dir.field_0;
    auVar34 = vxorps_avx512vl(in_ZMM27._0_16_,in_ZMM27._0_16_);
    auVar104 = ZEXT1664(auVar34);
    auVar35 = vmaxss_avx512f(auVar34,ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[3]));
    fVar76 = (ray->super_RayK<1>).tfar;
    auVar74 = ZEXT464((uint)fVar76);
    auVar36._8_4_ = 0x7fffffff;
    auVar36._0_8_ = 0x7fffffff7fffffff;
    auVar36._12_4_ = 0x7fffffff;
    auVar36 = vandps_avx512vl((undefined1  [16])aVar3,auVar36);
    auVar37._8_4_ = 0x219392ef;
    auVar37._0_8_ = 0x219392ef219392ef;
    auVar37._12_4_ = 0x219392ef;
    uVar32 = vcmpps_avx512vl(auVar36,auVar37,1);
    local_2370[0] = 0;
    auVar36 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
    auVar105 = ZEXT1664(auVar36);
    auVar36 = vdivps_avx512vl(auVar36,(undefined1  [16])aVar3);
    auVar37 = vbroadcastss_avx512vl(ZEXT416(0x5d5e0b6b));
    bVar6 = (bool)((byte)uVar32 & 1);
    auVar41._0_4_ = (uint)bVar6 * auVar37._0_4_ | (uint)!bVar6 * auVar36._0_4_;
    bVar6 = (bool)((byte)(uVar32 >> 1) & 1);
    auVar41._4_4_ = (uint)bVar6 * auVar37._4_4_ | (uint)!bVar6 * auVar36._4_4_;
    bVar6 = (bool)((byte)(uVar32 >> 2) & 1);
    auVar41._8_4_ = (uint)bVar6 * auVar37._8_4_ | (uint)!bVar6 * auVar36._8_4_;
    bVar6 = (bool)((byte)(uVar32 >> 3) & 1);
    auVar41._12_4_ = (uint)bVar6 * auVar37._12_4_ | (uint)!bVar6 * auVar36._12_4_;
    auVar38._8_4_ = 0x3f7ffffa;
    auVar38._0_8_ = 0x3f7ffffa3f7ffffa;
    auVar38._12_4_ = 0x3f7ffffa;
    vmulps_avx512vl(auVar41,auVar38);
    auVar39._8_4_ = 0x3f800003;
    auVar39._0_8_ = 0x3f8000033f800003;
    auVar39._12_4_ = 0x3f800003;
    auVar38 = vmulps_avx512vl(auVar41,auVar39);
    local_2528 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[0]));
    auVar106 = ZEXT3264(local_2528);
    auVar39 = vmaxss_avx512f(auVar34,ZEXT416((uint)fVar76));
    local_2548 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[1]));
    auVar107 = ZEXT3264(local_2548);
    local_2568 = vbroadcastss_avx512vl(ZEXT416((uint)(ray->super_RayK<1>).org.field_0.m128[2]));
    auVar108 = ZEXT3264(local_2568);
    auVar37 = vucomiss_avx512f(auVar34);
    fVar76 = auVar37._0_4_;
    auVar36 = vmovshdup_avx(auVar37);
    uVar79 = auVar36._0_8_;
    local_23b8._8_8_ = uVar79;
    local_23b8._0_8_ = uVar79;
    local_23b8._16_8_ = uVar79;
    local_23b8._24_8_ = uVar79;
    auVar91 = ZEXT3264(local_23b8);
    vshufpd_avx(auVar37,auVar37,1);
    auVar60._8_4_ = 2;
    auVar60._0_8_ = 0x200000002;
    auVar60._12_4_ = 2;
    auVar60._16_4_ = 2;
    auVar60._20_4_ = 2;
    auVar60._24_4_ = 2;
    auVar60._28_4_ = 2;
    local_23d8 = vpermps_avx2(auVar60,ZEXT1632(auVar37));
    auVar92 = ZEXT3264(local_23d8);
    fVar68 = auVar38._0_4_;
    auVar59._8_4_ = 1;
    auVar59._0_8_ = 0x100000001;
    auVar59._12_4_ = 1;
    auVar59._16_4_ = 1;
    auVar59._20_4_ = 1;
    auVar59._24_4_ = 1;
    auVar59._28_4_ = 1;
    local_2418 = vpermps_avx2(auVar59,ZEXT1632(auVar38));
    auVar99 = ZEXT3264(local_2418);
    local_2438 = vpermps_avx2(auVar60,ZEXT1632(auVar38));
    auVar100 = ZEXT3264(local_2438);
    lVar24 = 0;
    vucomiss_avx512f(auVar34);
    vucomiss_avx512f(auVar34);
    uVar75 = auVar35._0_4_;
    local_2458._4_4_ = uVar75;
    local_2458._0_4_ = uVar75;
    local_2458._8_4_ = uVar75;
    local_2458._12_4_ = uVar75;
    local_2458._16_4_ = uVar75;
    local_2458._20_4_ = uVar75;
    local_2458._24_4_ = uVar75;
    local_2458._28_4_ = uVar75;
    auVar101 = ZEXT3264(local_2458);
    uVar75 = auVar39._0_4_;
    auVar73 = ZEXT3264(CONCAT428(uVar75,CONCAT424(uVar75,CONCAT420(uVar75,CONCAT416(uVar75,CONCAT412
                                                  (uVar75,CONCAT48(uVar75,CONCAT44(uVar75,uVar75))))
                                                  ))));
    auVar102 = ZEXT3264(_DAT_01fe9900);
    auVar59 = vbroadcastss_avx512vl(ZEXT416(0xfffffff8));
    auVar103 = ZEXT3264(auVar59);
    local_25f8 = 0;
    local_2398 = fVar76;
    fStack_2394 = fVar76;
    fStack_2390 = fVar76;
    fStack_238c = fVar76;
    fStack_2388 = fVar76;
    fStack_2384 = fVar76;
    fStack_2380 = fVar76;
    fStack_237c = fVar76;
    local_23f8 = fVar68;
    fStack_23f4 = fVar68;
    fStack_23f0 = fVar68;
    fStack_23ec = fVar68;
    fStack_23e8 = fVar68;
    fStack_23e4 = fVar68;
    fStack_23e0 = fVar68;
    fStack_23dc = fVar68;
    fVar84 = fVar76;
    fVar85 = fVar76;
    fVar86 = fVar76;
    fVar87 = fVar76;
    fVar88 = fVar76;
    fVar89 = fVar76;
    fVar93 = fVar68;
    fVar94 = fVar68;
    fVar95 = fVar68;
    fVar96 = fVar68;
    fVar97 = fVar68;
    fVar98 = fVar68;
    local_2650 = ray;
    local_2648 = context;
    do {
      pfVar1 = (float *)(local_25f0 + -1);
      local_25f0 = local_25f0 + -2;
      if (*pfVar1 <= auVar74._0_4_) {
        uVar32 = *local_25f0;
        while( true ) {
          if ((uVar32 & 8) != 0) break;
          pauVar14 = (undefined1 (*) [32])(uVar32 & 0xfffffffffffffff0);
          uVar75 = *(undefined4 *)((long)&(ray->super_RayK<1>).dir.field_0 + 0xc);
          auVar64._4_4_ = uVar75;
          auVar64._0_4_ = uVar75;
          auVar64._8_4_ = uVar75;
          auVar64._12_4_ = uVar75;
          auVar64._16_4_ = uVar75;
          auVar64._20_4_ = uVar75;
          auVar64._24_4_ = uVar75;
          auVar64._28_4_ = uVar75;
          auVar36 = vfmadd213ps_fma(*(undefined1 (*) [32])(pauVar14[8] + lVar24),auVar64,
                                    *(undefined1 (*) [32])(pauVar14[2] + lVar24));
          auVar59 = vsubps_avx512vl(ZEXT1632(auVar36),auVar106._0_32_);
          auVar7._4_4_ = fVar84 * auVar59._4_4_;
          auVar7._0_4_ = fVar76 * auVar59._0_4_;
          auVar7._8_4_ = fVar85 * auVar59._8_4_;
          auVar7._12_4_ = fVar86 * auVar59._12_4_;
          auVar7._16_4_ = fVar87 * auVar59._16_4_;
          auVar7._20_4_ = fVar88 * auVar59._20_4_;
          auVar7._24_4_ = fVar89 * auVar59._24_4_;
          auVar7._28_4_ = auVar59._28_4_;
          auVar59 = vmaxps_avx(auVar101._0_32_,auVar7);
          auVar36 = vfmadd213ps_fma(pauVar14[10],auVar64,pauVar14[4]);
          auVar60 = vsubps_avx512vl(ZEXT1632(auVar36),auVar107._0_32_);
          auVar61._4_4_ = auVar91._4_4_ * auVar60._4_4_;
          auVar61._0_4_ = auVar91._0_4_ * auVar60._0_4_;
          auVar61._8_4_ = auVar91._8_4_ * auVar60._8_4_;
          auVar61._12_4_ = auVar91._12_4_ * auVar60._12_4_;
          auVar61._16_4_ = auVar91._16_4_ * auVar60._16_4_;
          auVar61._20_4_ = auVar91._20_4_ * auVar60._20_4_;
          auVar61._24_4_ = auVar91._24_4_ * auVar60._24_4_;
          auVar61._28_4_ = auVar60._28_4_;
          auVar36 = vfmadd213ps_fma(pauVar14[0xc],auVar64,pauVar14[6]);
          auVar60 = vsubps_avx512vl(ZEXT1632(auVar36),auVar108._0_32_);
          auVar62._4_4_ = auVar92._4_4_ * auVar60._4_4_;
          auVar62._0_4_ = auVar92._0_4_ * auVar60._0_4_;
          auVar62._8_4_ = auVar92._8_4_ * auVar60._8_4_;
          auVar62._12_4_ = auVar92._12_4_ * auVar60._12_4_;
          auVar62._16_4_ = auVar92._16_4_ * auVar60._16_4_;
          auVar62._20_4_ = auVar92._20_4_ * auVar60._20_4_;
          auVar62._24_4_ = auVar92._24_4_ * auVar60._24_4_;
          auVar62._28_4_ = auVar60._28_4_;
          auVar60 = vmaxps_avx(auVar61,auVar62);
          auVar59 = vmaxps_avx(auVar59,auVar60);
          auVar36 = vfmadd213ps_fma(pauVar14[9],auVar64,pauVar14[3]);
          auVar60 = vsubps_avx512vl(ZEXT1632(auVar36),auVar106._0_32_);
          auVar66._4_4_ = fVar93 * auVar60._4_4_;
          auVar66._0_4_ = fVar68 * auVar60._0_4_;
          auVar66._8_4_ = fVar94 * auVar60._8_4_;
          auVar66._12_4_ = fVar95 * auVar60._12_4_;
          auVar66._16_4_ = fVar96 * auVar60._16_4_;
          auVar66._20_4_ = fVar97 * auVar60._20_4_;
          auVar66._24_4_ = fVar98 * auVar60._24_4_;
          auVar66._28_4_ = auVar60._28_4_;
          auVar36 = vfmadd213ps_fma(pauVar14[0xb],auVar64,pauVar14[5]);
          auVar60 = vsubps_avx512vl(ZEXT1632(auVar36),auVar107._0_32_);
          auVar8._4_4_ = auVar99._4_4_ * auVar60._4_4_;
          auVar8._0_4_ = auVar99._0_4_ * auVar60._0_4_;
          auVar8._8_4_ = auVar99._8_4_ * auVar60._8_4_;
          auVar8._12_4_ = auVar99._12_4_ * auVar60._12_4_;
          auVar8._16_4_ = auVar99._16_4_ * auVar60._16_4_;
          auVar8._20_4_ = auVar99._20_4_ * auVar60._20_4_;
          auVar8._24_4_ = auVar99._24_4_ * auVar60._24_4_;
          auVar8._28_4_ = auVar60._28_4_;
          auVar36 = vfmadd213ps_fma(pauVar14[0xd],auVar64,pauVar14[7]);
          auVar60 = vsubps_avx512vl(ZEXT1632(auVar36),auVar108._0_32_);
          auVar65._4_4_ = auVar100._4_4_ * auVar60._4_4_;
          auVar65._0_4_ = auVar100._0_4_ * auVar60._0_4_;
          auVar65._8_4_ = auVar100._8_4_ * auVar60._8_4_;
          auVar65._12_4_ = auVar100._12_4_ * auVar60._12_4_;
          auVar65._16_4_ = auVar100._16_4_ * auVar60._16_4_;
          auVar65._20_4_ = auVar100._20_4_ * auVar60._20_4_;
          auVar65._24_4_ = auVar100._24_4_ * auVar60._24_4_;
          auVar65._28_4_ = auVar60._28_4_;
          auVar60 = vminps_avx(auVar8,auVar65);
          auVar7 = vminps_avx(auVar73._0_32_,auVar66);
          auVar60 = vminps_avx(auVar7,auVar60);
          uVar33 = vcmpps_avx512vl(auVar59,auVar60,2);
          if (((uint)uVar32 & 7) == 6) {
            uVar32 = vcmpps_avx512vl(auVar64,pauVar14[0xe],0xd);
            uVar20 = vcmpps_avx512vl(auVar64,pauVar14[0xf],1);
            uVar33 = uVar33 & uVar32 & uVar20;
          }
          bVar12 = (byte)uVar33;
          if (bVar12 == 0) {
            auVar36 = vmovshdup_avx(SUB3216(*(undefined1 (*) [32])
                                             ((long)&(ray->super_RayK<1>).dir.field_0 + 0xc),0));
            auVar74 = ZEXT1664(auVar36);
            goto LAB_01f22afd;
          }
          auVar60 = *pauVar14;
          auVar7 = pauVar14[1];
          auVar61 = vpternlogd_avx512vl(auVar102._0_32_,auVar59,auVar103._0_32_,0xf8);
          auVar62 = vpcompressd_avx512vl(auVar61);
          auVar63._0_4_ =
               (uint)(bVar12 & 1) * auVar62._0_4_ | (uint)!(bool)(bVar12 & 1) * auVar61._0_4_;
          bVar6 = (bool)((byte)(uVar33 >> 1) & 1);
          auVar63._4_4_ = (uint)bVar6 * auVar62._4_4_ | (uint)!bVar6 * auVar61._4_4_;
          bVar6 = (bool)((byte)(uVar33 >> 2) & 1);
          auVar63._8_4_ = (uint)bVar6 * auVar62._8_4_ | (uint)!bVar6 * auVar61._8_4_;
          bVar6 = (bool)((byte)(uVar33 >> 3) & 1);
          auVar63._12_4_ = (uint)bVar6 * auVar62._12_4_ | (uint)!bVar6 * auVar61._12_4_;
          bVar6 = (bool)((byte)(uVar33 >> 4) & 1);
          auVar63._16_4_ = (uint)bVar6 * auVar62._16_4_ | (uint)!bVar6 * auVar61._16_4_;
          bVar6 = (bool)((byte)(uVar33 >> 5) & 1);
          auVar63._20_4_ = (uint)bVar6 * auVar62._20_4_ | (uint)!bVar6 * auVar61._20_4_;
          bVar6 = (bool)((byte)(uVar33 >> 6) & 1);
          auVar63._24_4_ = (uint)bVar6 * auVar62._24_4_ | (uint)!bVar6 * auVar61._24_4_;
          bVar6 = SUB81(uVar33 >> 7,0);
          auVar63._28_4_ = (uint)bVar6 * auVar62._28_4_ | (uint)!bVar6 * auVar61._28_4_;
          auVar61 = vpermt2q_avx512vl(auVar60,auVar63,auVar7);
          uVar32 = auVar61._0_8_;
          bVar12 = bVar12 - 1 & bVar12;
          if (bVar12 != 0) {
            auVar61 = vpshufd_avx2(auVar63,0x55);
            vpermt2q_avx512vl(auVar60,auVar61,auVar7);
            auVar62 = vpminsd_avx2(auVar63,auVar61);
            auVar61 = vpmaxsd_avx2(auVar63,auVar61);
            bVar12 = bVar12 - 1 & bVar12;
            if (bVar12 == 0) {
              auVar62 = vpermi2q_avx512vl(auVar62,auVar60,auVar7);
              uVar32 = auVar62._0_8_;
              auVar60 = vpermt2q_avx512vl(auVar60,auVar61,auVar7);
              *local_25f0 = auVar60._0_8_;
              auVar59 = vpermd_avx2(auVar61,auVar59);
              *(int *)(local_25f0 + 1) = auVar59._0_4_;
              local_25f0 = local_25f0 + 2;
            }
            else {
              auVar8 = vpshufd_avx2(auVar63,0xaa);
              vpermt2q_avx512vl(auVar60,auVar8,auVar7);
              auVar66 = vpminsd_avx2(auVar62,auVar8);
              auVar62 = vpmaxsd_avx2(auVar62,auVar8);
              auVar8 = vpminsd_avx2(auVar61,auVar62);
              auVar61 = vpmaxsd_avx2(auVar61,auVar62);
              bVar12 = bVar12 - 1 & bVar12;
              if (bVar12 == 0) {
                auVar62 = vpermi2q_avx512vl(auVar66,auVar60,auVar7);
                uVar32 = auVar62._0_8_;
                auVar62 = vpermt2q_avx512vl(auVar60,auVar61,auVar7);
                *local_25f0 = auVar62._0_8_;
                auVar61 = vpermd_avx2(auVar61,auVar59);
                *(int *)(local_25f0 + 1) = auVar61._0_4_;
                auVar60 = vpermt2q_avx512vl(auVar60,auVar8,auVar7);
                local_25f0[2] = auVar60._0_8_;
                auVar59 = vpermd_avx2(auVar8,auVar59);
                *(int *)(local_25f0 + 3) = auVar59._0_4_;
                local_25f0 = local_25f0 + 4;
              }
              else {
                auVar62 = vpshufd_avx2(auVar63,0xff);
                vpermt2q_avx512vl(auVar60,auVar62,auVar7);
                auVar65 = vpminsd_avx2(auVar66,auVar62);
                auVar62 = vpmaxsd_avx2(auVar66,auVar62);
                auVar66 = vpminsd_avx2(auVar8,auVar62);
                auVar62 = vpmaxsd_avx2(auVar8,auVar62);
                auVar8 = vpminsd_avx2(auVar61,auVar62);
                auVar61 = vpmaxsd_avx2(auVar61,auVar62);
                bVar12 = bVar12 - 1 & bVar12;
                if (bVar12 == 0) {
                  auVar62 = vpermi2q_avx512vl(auVar65,auVar60,auVar7);
                  uVar32 = auVar62._0_8_;
                  auVar62 = vpermt2q_avx512vl(auVar60,auVar61,auVar7);
                  *local_25f0 = auVar62._0_8_;
                  auVar61 = vpermd_avx2(auVar61,auVar59);
                  *(int *)(local_25f0 + 1) = auVar61._0_4_;
                  auVar61 = vpermt2q_avx512vl(auVar60,auVar8,auVar7);
                  local_25f0[2] = auVar61._0_8_;
                  auVar61 = vpermd_avx2(auVar8,auVar59);
                  *(int *)(local_25f0 + 3) = auVar61._0_4_;
                  auVar60 = vpermt2q_avx512vl(auVar60,auVar66,auVar7);
                  local_25f0[4] = auVar60._0_8_;
                  auVar59 = vpermd_avx2(auVar66,auVar59);
                  *(int *)(local_25f0 + 5) = auVar59._0_4_;
                  local_25f0 = local_25f0 + 6;
                }
                else {
                  auVar64 = valignd_avx512vl(auVar63,auVar63,3);
                  auVar62 = vpmovsxbd_avx512vl(ZEXT816(0x303020108));
                  auVar65 = vpermt2d_avx512vl(ZEXT1632(CONCAT412(0x80000000,
                                                                 CONCAT48(0x80000000,
                                                                          0x8000000080000000))),
                                              auVar62,auVar65);
                  auVar62 = vpmovsxbd_avx2(ZEXT816(0x5040302010008));
                  auVar66 = vpermt2d_avx512vl(auVar65,auVar62,auVar66);
                  auVar66 = vpermt2d_avx512vl(auVar66,auVar62,auVar8);
                  auVar62 = vpmovsxbd_avx2(ZEXT816(0x605040302010008));
                  auVar61 = vpermt2d_avx512vl(auVar66,auVar62,auVar61);
                  auVar74 = ZEXT3264(auVar61);
                  bVar17 = bVar12;
                  do {
                    auVar62 = auVar74._0_32_;
                    auVar78._8_4_ = 1;
                    auVar78._0_8_ = 0x100000001;
                    auVar78._12_4_ = 1;
                    auVar78._16_4_ = 1;
                    auVar78._20_4_ = 1;
                    auVar78._24_4_ = 1;
                    auVar78._28_4_ = 1;
                    auVar61 = vpermd_avx2(auVar78,auVar64);
                    auVar64 = valignd_avx512vl(auVar64,auVar64,1);
                    vpermt2q_avx512vl(auVar60,auVar64,auVar7);
                    bVar17 = bVar17 - 1 & bVar17;
                    uVar79 = vpcmpd_avx512vl(auVar61,auVar62,5);
                    auVar61 = vpmaxsd_avx2(auVar61,auVar62);
                    bVar16 = (byte)uVar79 << 1;
                    auVar62 = valignd_avx512vl(auVar62,auVar62,7);
                    bVar6 = (bool)((byte)uVar79 & 1);
                    auVar67._4_4_ = (uint)bVar6 * auVar62._4_4_ | (uint)!bVar6 * auVar61._4_4_;
                    auVar67._0_4_ = auVar61._0_4_;
                    bVar6 = (bool)(bVar16 >> 2 & 1);
                    auVar67._8_4_ = (uint)bVar6 * auVar62._8_4_ | (uint)!bVar6 * auVar61._8_4_;
                    bVar6 = (bool)(bVar16 >> 3 & 1);
                    auVar67._12_4_ = (uint)bVar6 * auVar62._12_4_ | (uint)!bVar6 * auVar61._12_4_;
                    bVar6 = (bool)(bVar16 >> 4 & 1);
                    auVar67._16_4_ = (uint)bVar6 * auVar62._16_4_ | (uint)!bVar6 * auVar61._16_4_;
                    bVar6 = (bool)(bVar16 >> 5 & 1);
                    auVar67._20_4_ = (uint)bVar6 * auVar62._20_4_ | (uint)!bVar6 * auVar61._20_4_;
                    bVar6 = (bool)(bVar16 >> 6 & 1);
                    auVar67._24_4_ = (uint)bVar6 * auVar62._24_4_ | (uint)!bVar6 * auVar61._24_4_;
                    auVar67._28_4_ =
                         (uint)(bVar16 >> 7) * auVar62._28_4_ |
                         (uint)!(bool)(bVar16 >> 7) * auVar61._28_4_;
                    auVar74 = ZEXT3264(auVar67);
                  } while (bVar17 != 0);
                  lVar15 = (ulong)(uint)POPCOUNT((uint)bVar12) + 3;
                  do {
                    auVar61 = vpermi2q_avx512vl(auVar67,auVar60,auVar7);
                    *local_25f0 = auVar61._0_8_;
                    auVar62 = auVar74._0_32_;
                    auVar61 = vpermd_avx2(auVar62,auVar59);
                    *(int *)(local_25f0 + 1) = auVar61._0_4_;
                    auVar67 = valignd_avx512vl(auVar62,auVar62,1);
                    local_25f0 = local_25f0 + 2;
                    auVar74 = ZEXT3264(auVar67);
                    lVar15 = lVar15 + -1;
                  } while (lVar15 != 0);
                  auVar59 = vpermt2q_avx512vl(auVar60,auVar67,auVar7);
                  uVar32 = auVar59._0_8_;
                }
                auVar36 = vxorps_avx512vl(auVar104._0_16_,auVar104._0_16_);
                auVar104 = ZEXT1664(auVar36);
                auVar106 = ZEXT3264(local_2528);
                auVar107 = ZEXT3264(local_2548);
                auVar108 = ZEXT3264(local_2568);
                auVar91 = ZEXT3264(auVar91._0_32_);
                auVar92 = ZEXT3264(auVar92._0_32_);
                auVar99 = ZEXT3264(auVar99._0_32_);
                auVar100 = ZEXT3264(auVar100._0_32_);
                auVar101 = ZEXT3264(auVar101._0_32_);
                auVar102 = ZEXT3264(auVar102._0_32_);
                auVar103 = ZEXT3264(auVar103._0_32_);
                ray = local_2650;
                context = local_2648;
              }
            }
          }
        }
        local_25e8 = (ulong)((uint)uVar32 & 0xf) - 8;
        if (local_25e8 != 0) {
          uVar32 = uVar32 & 0xfffffffffffffff0;
          pSVar28 = context->scene;
          local_25e0 = 0;
          local_2628 = pSVar28;
          do {
            lVar19 = local_25e0 * 0x50;
            pGVar5 = (pSVar28->geometries).items[*(uint *)(uVar32 + 0x30 + lVar19)].ptr;
            fVar76 = (pGVar5->time_range).lower;
            fVar76 = pGVar5->fnumTimeSegments *
                     (((ray->super_RayK<1>).dir.field_0.m128[3] - fVar76) /
                     ((pGVar5->time_range).upper - fVar76));
            auVar36 = vroundss_avx(ZEXT416((uint)fVar76),ZEXT416((uint)fVar76),9);
            auVar36 = vminss_avx(auVar36,ZEXT416((uint)(pGVar5->fnumTimeSegments + -1.0)));
            auVar40 = vmaxss_avx512f(auVar104._0_16_,auVar36);
            lVar15 = (long)(int)auVar40._0_4_ * 0x38;
            local_2630 = (ulong)*(uint *)(uVar32 + 4 + lVar19);
            lVar24 = *(long *)(*(long *)&pGVar5[2].numPrimitives + lVar15);
            lVar15 = *(long *)(*(long *)&pGVar5[2].numPrimitives + 0x38 + lVar15);
            auVar36 = *(undefined1 (*) [16])(lVar24 + (ulong)*(uint *)(uVar32 + lVar19) * 4);
            uVar33 = (ulong)*(uint *)(uVar32 + 0x10 + lVar19);
            auVar37 = *(undefined1 (*) [16])(lVar24 + uVar33 * 4);
            uVar20 = CONCAT44(0,*(uint *)(uVar32 + 0x20 + lVar19));
            local_2608._0_8_ = uVar20;
            auVar38 = *(undefined1 (*) [16])(lVar24 + uVar20 * 4);
            auVar39 = *(undefined1 (*) [16])(lVar24 + local_2630 * 4);
            uVar21 = (ulong)*(uint *)(uVar32 + 0x14 + lVar19);
            auVar34 = *(undefined1 (*) [16])(lVar24 + uVar21 * 4);
            uVar22 = CONCAT44(0,*(uint *)(uVar32 + 0x24 + lVar19));
            local_2618._0_8_ = uVar22;
            auVar35 = *(undefined1 (*) [16])(lVar24 + uVar22 * 4);
            uVar23 = (ulong)*(uint *)(uVar32 + 8 + lVar19);
            auVar41 = *(undefined1 (*) [16])(lVar24 + uVar23 * 4);
            uVar29 = (ulong)*(uint *)(uVar32 + 0x18 + lVar19);
            auVar43 = *(undefined1 (*) [16])(lVar24 + uVar29 * 4);
            uVar27 = (ulong)*(uint *)(uVar32 + 0x28 + lVar19);
            auVar53 = *(undefined1 (*) [16])(lVar24 + uVar27 * 4);
            uVar26 = (ulong)*(uint *)(uVar32 + 0xc + lVar19);
            auVar51 = *(undefined1 (*) [16])(lVar24 + uVar26 * 4);
            uVar25 = (ulong)*(uint *)(uVar32 + 0x1c + lVar19);
            auVar52 = *(undefined1 (*) [16])(lVar24 + uVar25 * 4);
            uVar31 = (ulong)*(uint *)(uVar32 + 0x2c + lVar19);
            auVar42 = *(undefined1 (*) [16])(lVar24 + uVar31 * 4);
            auVar44 = *(undefined1 (*) [16])(lVar15 + (ulong)*(uint *)(uVar32 + lVar19) * 4);
            auVar45 = *(undefined1 (*) [16])(lVar15 + uVar33 * 4);
            auVar48 = *(undefined1 (*) [16])(lVar15 + uVar20 * 4);
            auVar46 = *(undefined1 (*) [16])(lVar15 + local_2630 * 4);
            auVar47 = *(undefined1 (*) [16])(lVar15 + uVar21 * 4);
            auVar49 = *(undefined1 (*) [16])(lVar15 + uVar22 * 4);
            auVar50 = *(undefined1 (*) [16])(lVar15 + uVar23 * 4);
            auVar54 = *(undefined1 (*) [16])(lVar15 + uVar29 * 4);
            auVar55 = *(undefined1 (*) [16])(lVar15 + uVar27 * 4);
            auVar56 = *(undefined1 (*) [16])(lVar15 + uVar26 * 4);
            auVar77 = *(undefined1 (*) [16])(lVar15 + uVar25 * 4);
            auVar80 = *(undefined1 (*) [16])(lVar15 + uVar31 * 4);
            puVar2 = (undefined8 *)(uVar32 + 0x30 + lVar19);
            local_2468 = *puVar2;
            uStack_2460 = puVar2[1];
            puVar2 = (undefined8 *)(uVar32 + 0x40 + lVar19);
            auVar81 = vunpcklps_avx(auVar36,auVar41);
            auVar36 = vunpckhps_avx(auVar36,auVar41);
            auVar41 = vunpcklps_avx(auVar39,auVar51);
            auVar39 = vunpckhps_avx(auVar39,auVar51);
            auVar51 = vunpcklps_avx(auVar36,auVar39);
            auVar82 = vunpcklps_avx(auVar81,auVar41);
            auVar36 = vunpckhps_avx(auVar81,auVar41);
            auVar41 = vunpcklps_avx(auVar37,auVar43);
            auVar37 = vunpckhps_avx(auVar37,auVar43);
            auVar43 = vunpcklps_avx(auVar34,auVar52);
            auVar39 = vunpckhps_avx(auVar34,auVar52);
            auVar34 = vunpcklps_avx(auVar37,auVar39);
            auVar52 = vunpcklps_avx(auVar41,auVar43);
            auVar37 = vunpckhps_avx(auVar41,auVar43);
            auVar41 = vunpcklps_avx(auVar38,auVar53);
            auVar38 = vunpckhps_avx(auVar38,auVar53);
            auVar43 = vunpcklps_avx(auVar35,auVar42);
            auVar39 = vunpckhps_avx(auVar35,auVar42);
            auVar35 = vunpcklps_avx(auVar38,auVar39);
            auVar53 = vunpcklps_avx(auVar41,auVar43);
            auVar38 = vunpckhps_avx(auVar41,auVar43);
            auVar39 = vunpcklps_avx512vl(auVar44,auVar50);
            auVar41 = vunpckhps_avx512vl(auVar44,auVar50);
            auVar42 = vunpcklps_avx512vl(auVar46,auVar56);
            auVar43 = vunpckhps_avx512vl(auVar46,auVar56);
            auVar41 = vunpcklps_avx(auVar41,auVar43);
            auVar43 = vunpcklps_avx(auVar39,auVar42);
            auVar39 = vunpckhps_avx(auVar39,auVar42);
            auVar42 = vunpcklps_avx512vl(auVar45,auVar54);
            auVar44 = vunpckhps_avx512vl(auVar45,auVar54);
            auVar45 = vunpcklps_avx512vl(auVar47,auVar77);
            auVar46 = vunpckhps_avx512vl(auVar47,auVar77);
            auVar44 = vunpcklps_avx512vl(auVar44,auVar46);
            auVar46 = vunpcklps_avx512vl(auVar42,auVar45);
            auVar45 = vunpckhps_avx512vl(auVar42,auVar45);
            auVar47 = vunpcklps_avx512vl(auVar48,auVar55);
            auVar42 = vunpckhps_avx512vl(auVar48,auVar55);
            auVar48 = vunpcklps_avx512vl(auVar49,auVar80);
            auVar49 = vunpckhps_avx512vl(auVar49,auVar80);
            auVar42 = vunpcklps_avx(auVar42,auVar49);
            auVar49 = vunpcklps_avx512vl(auVar47,auVar48);
            auVar48 = vunpckhps_avx512vl(auVar47,auVar48);
            auVar50 = ZEXT416((uint)(fVar76 - auVar40._0_4_));
            auVar47 = vbroadcastss_avx512vl(auVar50);
            auVar50 = vsubss_avx512f(ZEXT416(0x3f800000),auVar50);
            auVar54._0_4_ = auVar50._0_4_;
            auVar54._4_4_ = auVar54._0_4_;
            auVar54._8_4_ = auVar54._0_4_;
            auVar54._12_4_ = auVar54._0_4_;
            auVar43 = vmulps_avx512vl(auVar47,auVar43);
            auVar50 = vmulps_avx512vl(auVar47,auVar39);
            auVar41 = vmulps_avx512vl(auVar47,auVar41);
            auVar39 = vfmadd231ps_fma(auVar43,auVar54,auVar82);
            auVar50 = vfmadd231ps_avx512vl(auVar50,auVar54,auVar36);
            auVar41 = vfmadd231ps_fma(auVar41,auVar54,auVar51);
            auVar36 = vmulps_avx512vl(auVar47,auVar46);
            auVar51 = vmulps_avx512vl(auVar47,auVar45);
            auVar44 = vmulps_avx512vl(auVar47,auVar44);
            auVar43 = vfmadd231ps_fma(auVar36,auVar54,auVar52);
            auVar51 = vfmadd231ps_fma(auVar51,auVar54,auVar37);
            auVar52 = vfmadd231ps_avx512vl(auVar44,auVar54,auVar34);
            auVar36 = vmulps_avx512vl(auVar47,auVar49);
            auVar37 = vmulps_avx512vl(auVar47,auVar48);
            auVar42 = vmulps_avx512vl(auVar47,auVar42);
            auVar34 = vfmadd231ps_fma(auVar36,auVar54,auVar53);
            auVar53 = vfmadd231ps_fma(auVar37,auVar54,auVar38);
            auVar35 = vfmadd231ps_fma(auVar42,auVar54,auVar35);
            local_2578 = *puVar2;
            uStack_2570 = puVar2[1];
            uVar75 = *(undefined4 *)&(local_2650->super_RayK<1>).org.field_0;
            auVar44._4_4_ = uVar75;
            auVar44._0_4_ = uVar75;
            auVar44._8_4_ = uVar75;
            auVar44._12_4_ = uVar75;
            uVar75 = *(undefined4 *)((long)&(local_2650->super_RayK<1>).org.field_0 + 4);
            auVar45._4_4_ = uVar75;
            auVar45._0_4_ = uVar75;
            auVar45._8_4_ = uVar75;
            auVar45._12_4_ = uVar75;
            uVar75 = *(undefined4 *)((long)&(local_2650->super_RayK<1>).org.field_0 + 8);
            auVar48._4_4_ = uVar75;
            auVar48._0_4_ = uVar75;
            auVar48._8_4_ = uVar75;
            auVar48._12_4_ = uVar75;
            uVar75 = *(undefined4 *)&(local_2650->super_RayK<1>).dir.field_0;
            auVar80._4_4_ = uVar75;
            auVar80._0_4_ = uVar75;
            auVar80._8_4_ = uVar75;
            auVar80._12_4_ = uVar75;
            uVar75 = *(undefined4 *)((long)&(local_2650->super_RayK<1>).dir.field_0 + 4);
            auVar81._4_4_ = uVar75;
            auVar81._0_4_ = uVar75;
            auVar81._8_4_ = uVar75;
            auVar81._12_4_ = uVar75;
            local_2659 = 0;
            fVar76 = (local_2650->super_RayK<1>).dir.field_0.m128[2];
            auVar90._4_4_ = fVar76;
            auVar90._0_4_ = fVar76;
            auVar90._8_4_ = fVar76;
            auVar90._12_4_ = fVar76;
            auVar36 = vsubps_avx(auVar39,auVar44);
            auVar42 = vsubps_avx512vl(auVar50,auVar45);
            auVar37 = vsubps_avx(auVar41,auVar48);
            auVar38 = vsubps_avx(auVar43,auVar44);
            auVar41 = vsubps_avx512vl(auVar51,auVar45);
            auVar43 = vsubps_avx512vl(auVar52,auVar48);
            auVar51 = vsubps_avx512vl(auVar34,auVar44);
            auVar39 = vsubps_avx(auVar53,auVar45);
            auVar53 = vsubps_avx512vl(auVar35,auVar48);
            auVar52 = vsubps_avx512vl(auVar51,auVar36);
            auVar34 = vsubps_avx(auVar39,auVar42);
            auVar44 = vsubps_avx512vl(auVar53,auVar37);
            auVar45 = vsubps_avx512vl(auVar36,auVar38);
            auVar48 = vsubps_avx512vl(auVar42,auVar41);
            auVar46 = vsubps_avx512vl(auVar37,auVar43);
            auVar47 = vsubps_avx512vl(auVar38,auVar51);
            auVar49 = vsubps_avx512vl(auVar41,auVar39);
            auVar50 = vsubps_avx512vl(auVar43,auVar53);
            auVar35 = vaddps_avx512vl(auVar51,auVar36);
            auVar82._0_4_ = auVar39._0_4_ + auVar42._0_4_;
            auVar82._4_4_ = auVar39._4_4_ + auVar42._4_4_;
            auVar82._8_4_ = auVar39._8_4_ + auVar42._8_4_;
            auVar82._12_4_ = auVar39._12_4_ + auVar42._12_4_;
            auVar54 = vaddps_avx512vl(auVar53,auVar37);
            auVar55 = vmulps_avx512vl(auVar82,auVar44);
            auVar55 = vfmsub231ps_avx512vl(auVar55,auVar34,auVar54);
            auVar54 = vmulps_avx512vl(auVar54,auVar52);
            auVar54 = vfmsub231ps_avx512vl(auVar54,auVar44,auVar35);
            auVar56._0_4_ = auVar34._0_4_ * auVar35._0_4_;
            auVar56._4_4_ = auVar34._4_4_ * auVar35._4_4_;
            auVar56._8_4_ = auVar34._8_4_ * auVar35._8_4_;
            auVar56._12_4_ = auVar34._12_4_ * auVar35._12_4_;
            auVar35 = vfmsub231ps_fma(auVar56,auVar52,auVar82);
            auVar77._0_4_ = fVar76 * auVar35._0_4_;
            auVar77._4_4_ = fVar76 * auVar35._4_4_;
            auVar77._8_4_ = fVar76 * auVar35._8_4_;
            auVar77._12_4_ = fVar76 * auVar35._12_4_;
            auVar35 = vfmadd231ps_avx512vl(auVar77,auVar81,auVar54);
            local_2508 = vfmadd231ps_avx512vl(auVar35,auVar80,auVar55);
            auVar40._0_4_ = auVar38._0_4_ + auVar36._0_4_;
            auVar40._4_4_ = auVar38._4_4_ + auVar36._4_4_;
            auVar40._8_4_ = auVar38._8_4_ + auVar36._8_4_;
            auVar40._12_4_ = auVar38._12_4_ + auVar36._12_4_;
            auVar35 = vaddps_avx512vl(auVar42,auVar41);
            auVar54 = vaddps_avx512vl(auVar37,auVar43);
            auVar55 = vmulps_avx512vl(auVar35,auVar46);
            auVar55 = vfmsub231ps_avx512vl(auVar55,auVar48,auVar54);
            auVar54 = vmulps_avx512vl(auVar54,auVar45);
            auVar54 = vfmsub231ps_avx512vl(auVar54,auVar46,auVar40);
            auVar56 = vmulps_avx512vl(auVar40,auVar48);
            auVar35 = vfmsub231ps_avx512vl(auVar56,auVar45,auVar35);
            auVar83._0_4_ = fVar76 * auVar35._0_4_;
            auVar83._4_4_ = fVar76 * auVar35._4_4_;
            auVar83._8_4_ = fVar76 * auVar35._8_4_;
            auVar83._12_4_ = fVar76 * auVar35._12_4_;
            auVar35 = vfmadd231ps_avx512vl(auVar83,auVar81,auVar54);
            local_24f8 = vfmadd231ps_avx512vl(auVar35,auVar80,auVar55);
            auVar38 = vaddps_avx512vl(auVar38,auVar51);
            auVar39 = vaddps_avx512vl(auVar41,auVar39);
            auVar35 = vaddps_avx512vl(auVar43,auVar53);
            auVar41 = vmulps_avx512vl(auVar39,auVar50);
            auVar41 = vfmsub231ps_avx512vl(auVar41,auVar49,auVar35);
            auVar35 = vmulps_avx512vl(auVar35,auVar47);
            auVar35 = vfmsub231ps_avx512vl(auVar35,auVar50,auVar38);
            auVar51._0_4_ = auVar38._0_4_ * auVar49._0_4_;
            auVar51._4_4_ = auVar38._4_4_ * auVar49._4_4_;
            auVar51._8_4_ = auVar38._8_4_ * auVar49._8_4_;
            auVar51._12_4_ = auVar38._12_4_ * auVar49._12_4_;
            auVar38 = vfmsub231ps_fma(auVar51,auVar47,auVar39);
            auVar38 = vmulps_avx512vl(auVar90,auVar38);
            auVar38 = vfmadd231ps_avx512vl(auVar38,auVar81,auVar35);
            auVar38 = vfmadd231ps_avx512vl(auVar38,auVar80,auVar41);
            auVar53._0_4_ = local_24f8._0_4_ + local_2508._0_4_;
            auVar53._4_4_ = local_24f8._4_4_ + local_2508._4_4_;
            auVar53._8_4_ = local_24f8._8_4_ + local_2508._8_4_;
            auVar53._12_4_ = local_24f8._12_4_ + local_2508._12_4_;
            local_24e8 = vaddps_avx512vl(auVar38,auVar53);
            auVar35._8_4_ = 0x7fffffff;
            auVar35._0_8_ = 0x7fffffff7fffffff;
            auVar35._12_4_ = 0x7fffffff;
            auVar39 = vandps_avx512vl(local_24e8,auVar35);
            auVar43._8_4_ = 0x34000000;
            auVar43._0_8_ = 0x3400000034000000;
            auVar43._12_4_ = 0x34000000;
            auVar35 = vmulps_avx512vl(auVar39,auVar43);
            auVar41 = vminps_avx512vl(local_2508,local_24f8);
            auVar41 = vminps_avx512vl(auVar41,auVar38);
            auVar43 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
            auVar43 = vxorps_avx512vl(auVar35,auVar43);
            uVar79 = vcmpps_avx512vl(auVar41,auVar43,5);
            auVar41 = vmaxps_avx512vl(local_2508,local_24f8);
            auVar38 = vmaxps_avx512vl(auVar41,auVar38);
            uVar9 = vcmpps_avx512vl(auVar38,auVar35,2);
            bVar12 = ((byte)uVar79 | (byte)uVar9) & 0xf;
            ray = local_2650;
            context = local_2648;
            pSVar28 = local_2628;
            if (bVar12 != 0) {
              auVar38 = vmulps_avx512vl(auVar44,auVar48);
              auVar35 = vmulps_avx512vl(auVar52,auVar46);
              auVar41 = vmulps_avx512vl(auVar34,auVar45);
              auVar43 = vmulps_avx512vl(auVar46,auVar49);
              auVar53 = vmulps_avx512vl(auVar45,auVar50);
              auVar51 = vmulps_avx512vl(auVar48,auVar47);
              auVar34 = vfmsub213ps_avx512vl(auVar34,auVar46,auVar38);
              auVar44 = vfmsub213ps_avx512vl(auVar44,auVar45,auVar35);
              auVar52 = vfmsub213ps_avx512vl(auVar52,auVar48,auVar41);
              auVar48 = vfmsub213ps_avx512vl(auVar50,auVar48,auVar43);
              auVar46 = vfmsub213ps_avx512vl(auVar47,auVar46,auVar53);
              auVar45 = vfmsub213ps_avx512vl(auVar49,auVar45,auVar51);
              auVar47 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
              auVar38 = vandps_avx512vl(auVar38,auVar47);
              auVar43 = vandps_avx512vl(auVar43,auVar47);
              uVar33 = vcmpps_avx512vl(auVar38,auVar43,1);
              auVar38 = vandps_avx512vl(auVar35,auVar47);
              auVar35 = vandps_avx512vl(auVar53,auVar47);
              uVar20 = vcmpps_avx512vl(auVar38,auVar35,1);
              auVar38 = vandps_avx512vl(auVar41,auVar47);
              auVar35 = vandps_avx512vl(auVar51,auVar47);
              uVar21 = vcmpps_avx512vl(auVar38,auVar35,1);
              bVar6 = (bool)((byte)uVar33 & 1);
              local_2498._0_4_ = (uint)bVar6 * auVar34._0_4_ | (uint)!bVar6 * auVar48._0_4_;
              bVar6 = (bool)((byte)(uVar33 >> 1) & 1);
              local_2498._4_4_ = (uint)bVar6 * auVar34._4_4_ | (uint)!bVar6 * auVar48._4_4_;
              bVar6 = (bool)((byte)(uVar33 >> 2) & 1);
              local_2498._8_4_ = (uint)bVar6 * auVar34._8_4_ | (uint)!bVar6 * auVar48._8_4_;
              bVar6 = (bool)((byte)(uVar33 >> 3) & 1);
              local_2498._12_4_ = (uint)bVar6 * auVar34._12_4_ | (uint)!bVar6 * auVar48._12_4_;
              bVar6 = (bool)((byte)uVar20 & 1);
              local_2488._0_4_ = (uint)bVar6 * auVar44._0_4_ | (uint)!bVar6 * auVar46._0_4_;
              bVar6 = (bool)((byte)(uVar20 >> 1) & 1);
              local_2488._4_4_ = (uint)bVar6 * auVar44._4_4_ | (uint)!bVar6 * auVar46._4_4_;
              bVar6 = (bool)((byte)(uVar20 >> 2) & 1);
              local_2488._8_4_ = (uint)bVar6 * auVar44._8_4_ | (uint)!bVar6 * auVar46._8_4_;
              bVar6 = (bool)((byte)(uVar20 >> 3) & 1);
              local_2488._12_4_ = (uint)bVar6 * auVar44._12_4_ | (uint)!bVar6 * auVar46._12_4_;
              bVar6 = (bool)((byte)uVar21 & 1);
              local_2478[0] = (float)((uint)bVar6 * auVar52._0_4_ | (uint)!bVar6 * auVar45._0_4_);
              bVar6 = (bool)((byte)(uVar21 >> 1) & 1);
              local_2478[1] = (float)((uint)bVar6 * auVar52._4_4_ | (uint)!bVar6 * auVar45._4_4_);
              bVar6 = (bool)((byte)(uVar21 >> 2) & 1);
              local_2478[2] = (float)((uint)bVar6 * auVar52._8_4_ | (uint)!bVar6 * auVar45._8_4_);
              bVar6 = (bool)((byte)(uVar21 >> 3) & 1);
              local_2478[3] = (float)((uint)bVar6 * auVar52._12_4_ | (uint)!bVar6 * auVar45._12_4_);
              auVar49._0_4_ = fVar76 * local_2478[0];
              auVar49._4_4_ = fVar76 * local_2478[1];
              auVar49._8_4_ = fVar76 * local_2478[2];
              auVar49._12_4_ = fVar76 * local_2478[3];
              auVar38 = vfmadd213ps_fma(auVar81,local_2488,auVar49);
              auVar38 = vfmadd213ps_fma(auVar80,local_2498,auVar38);
              auVar46._0_4_ = auVar38._0_4_ + auVar38._0_4_;
              auVar46._4_4_ = auVar38._4_4_ + auVar38._4_4_;
              auVar46._8_4_ = auVar38._8_4_ + auVar38._8_4_;
              auVar46._12_4_ = auVar38._12_4_ + auVar38._12_4_;
              auVar47._0_4_ = auVar37._0_4_ * local_2478[0];
              auVar47._4_4_ = auVar37._4_4_ * local_2478[1];
              auVar47._8_4_ = auVar37._8_4_ * local_2478[2];
              auVar47._12_4_ = auVar37._12_4_ * local_2478[3];
              auVar37 = vfmadd213ps_fma(auVar42,local_2488,auVar47);
              auVar37 = vfmadd213ps_fma(auVar36,local_2498,auVar37);
              auVar36 = vrcp14ps_avx512vl(auVar46);
              auVar35 = auVar105._0_16_;
              auVar38 = vfnmadd213ps_avx512vl(auVar36,auVar46,auVar35);
              auVar36 = vfmadd132ps_fma(auVar38,auVar36,auVar36);
              local_24a8._0_4_ = (auVar37._0_4_ + auVar37._0_4_) * auVar36._0_4_;
              local_24a8._4_4_ = (auVar37._4_4_ + auVar37._4_4_) * auVar36._4_4_;
              local_24a8._8_4_ = (auVar37._8_4_ + auVar37._8_4_) * auVar36._8_4_;
              local_24a8._12_4_ = (auVar37._12_4_ + auVar37._12_4_) * auVar36._12_4_;
              auVar73 = ZEXT1664(local_24a8);
              uVar75 = *(undefined4 *)((long)&(local_2650->super_RayK<1>).org.field_0 + 0xc);
              auVar34._4_4_ = uVar75;
              auVar34._0_4_ = uVar75;
              auVar34._8_4_ = uVar75;
              auVar34._12_4_ = uVar75;
              uVar79 = vcmpps_avx512vl(local_24a8,auVar34,0xd);
              uVar33 = CONCAT44(auVar46._4_4_,auVar46._0_4_);
              auVar42._0_8_ = uVar33 ^ 0x8000000080000000;
              auVar42._8_4_ = -auVar46._8_4_;
              auVar42._12_4_ = -auVar46._12_4_;
              fVar76 = (local_2650->super_RayK<1>).tfar;
              auVar52._4_4_ = fVar76;
              auVar52._0_4_ = fVar76;
              auVar52._8_4_ = fVar76;
              auVar52._12_4_ = fVar76;
              uVar9 = vcmpps_avx512vl(local_24a8,auVar52,2);
              uVar10 = vcmpps_avx512vl(auVar46,auVar42,4);
              bVar12 = (byte)uVar79 & (byte)uVar9 & (byte)uVar10 & bVar12;
              if (bVar12 != 0) {
                auVar50._0_4_ = (local_2650->super_RayK<1>).tfar;
                auVar50._4_4_ = (local_2650->super_RayK<1>).mask;
                auVar50._8_4_ = (local_2650->super_RayK<1>).id;
                auVar50._12_4_ = (local_2650->super_RayK<1>).flags;
                auVar74 = ZEXT1664(auVar50);
                uVar13 = vextractps_avx(auVar50,1);
                local_24d8 = &local_2659;
                local_24d0 = bVar12;
                auVar55._8_4_ = 0x219392ef;
                auVar55._0_8_ = 0x219392ef219392ef;
                auVar55._12_4_ = 0x219392ef;
                uVar33 = vcmpps_avx512vl(auVar39,auVar55,5);
                auVar36 = vrcp14ps_avx512vl(local_24e8);
                auVar37 = vfnmadd213ps_avx512vl(local_24e8,auVar36,auVar35);
                auVar36 = vfmadd132ps_avx512vl(auVar37,auVar36,auVar36);
                fVar76 = (float)((uint)((byte)uVar33 & 1) * auVar36._0_4_);
                fVar84 = (float)((uint)((byte)(uVar33 >> 1) & 1) * auVar36._4_4_);
                fVar85 = (float)((uint)((byte)(uVar33 >> 2) & 1) * auVar36._8_4_);
                fVar86 = (float)((uint)((byte)(uVar33 >> 3) & 1) * auVar36._12_4_);
                auVar69._0_4_ = fVar76 * local_2508._0_4_;
                auVar69._4_4_ = fVar84 * local_2508._4_4_;
                auVar69._8_4_ = fVar85 * local_2508._8_4_;
                auVar69._12_4_ = fVar86 * local_2508._12_4_;
                local_24c8 = vminps_avx512vl(auVar69,auVar35);
                auVar70._0_4_ = fVar76 * local_24f8._0_4_;
                auVar70._4_4_ = fVar84 * local_24f8._4_4_;
                auVar70._8_4_ = fVar85 * local_24f8._8_4_;
                auVar70._12_4_ = fVar86 * local_24f8._12_4_;
                local_24b8 = vminps_avx512vl(auVar70,auVar35);
                auVar71._8_4_ = 0x7f800000;
                auVar71._0_8_ = 0x7f8000007f800000;
                auVar71._12_4_ = 0x7f800000;
                auVar36 = vblendmps_avx512vl(auVar71,local_24a8);
                auVar57._0_4_ =
                     (uint)(bVar12 & 1) * auVar36._0_4_ | (uint)!(bool)(bVar12 & 1) * 0x7f800000;
                bVar6 = (bool)(bVar12 >> 1 & 1);
                auVar57._4_4_ = (uint)bVar6 * auVar36._4_4_ | (uint)!bVar6 * 0x7f800000;
                bVar6 = (bool)(bVar12 >> 2 & 1);
                auVar57._8_4_ = (uint)bVar6 * auVar36._8_4_ | (uint)!bVar6 * 0x7f800000;
                auVar57._12_4_ =
                     (uint)(bVar12 >> 3) * auVar36._12_4_ | (uint)!(bool)(bVar12 >> 3) * 0x7f800000;
                auVar36 = vshufps_avx(auVar57,auVar57,0xb1);
                auVar36 = vminps_avx(auVar36,auVar57);
                auVar37 = vshufpd_avx(auVar36,auVar36,1);
                auVar36 = vminps_avx(auVar37,auVar36);
                uVar79 = vcmpps_avx512vl(auVar57,auVar36,0);
                bVar17 = (byte)uVar79 & bVar12;
                do {
                  auVar36 = auVar104._0_16_;
                  bVar16 = bVar12;
                  if (bVar17 != 0) {
                    bVar16 = bVar17;
                  }
                  uVar30 = 0;
                  for (uVar18 = (uint)bVar16; (uVar18 & 1) == 0; uVar18 = uVar18 >> 1 | 0x80000000)
                  {
                    uVar30 = uVar30 + 1;
                  }
                  local_2638 = (ulong)uVar30;
                  local_2590 = *(uint *)((long)&local_2468 + local_2638 * 4);
                  local_2658 = (pSVar28->geometries).items[local_2590].ptr;
                  if ((local_2658->mask & uVar13) == 0) {
                    bVar12 = ~(byte)(1 << (uVar30 & 0x1f)) & bVar12;
                  }
                  else {
                    local_2640 = context->args;
                    auVar37 = auVar74._0_16_;
                    if (local_2640->filter == (RTCFilterFunctionN)0x0) {
                      local_25d8.context = context->user;
                      if (local_2658->intersectionFilterN == (RTCFilterFunctionN)0x0) {
                        uVar33 = (ulong)(uVar30 << 2);
                        fVar76 = *(float *)(local_24c8 + uVar33);
                        fVar84 = *(float *)(local_24b8 + uVar33);
                        (ray->super_RayK<1>).tfar = *(float *)(local_24a8 + uVar33);
                        (ray->Ng).field_0.field_0.x = *(float *)(local_2498 + uVar33);
                        (ray->Ng).field_0.field_0.y = *(float *)(local_2488 + uVar33);
                        (ray->Ng).field_0.field_0.z = *(float *)((long)local_2478 + uVar33);
                        ray->u = fVar76;
                        ray->v = fVar84;
                        ray->primID = *(uint *)((long)&local_2578 + uVar33);
                        ray->geomID = local_2590;
                        ray->instID[0] = (local_25d8.context)->instID[0];
                        ray->instPrimID[0] = (local_25d8.context)->instPrimID[0];
                        break;
                      }
                      local_2618 = auVar37;
                    }
                    else {
                      local_2618 = auVar37;
                      local_25d8.context = context->user;
                    }
                    uVar33 = (ulong)(uVar30 * 4);
                    local_25a8 = *(float *)(local_2498 + uVar33);
                    local_25a4 = *(undefined4 *)(local_2488 + uVar33);
                    local_25a0 = *(undefined4 *)((long)local_2478 + uVar33);
                    local_259c = *(undefined4 *)(local_24c8 + uVar33);
                    local_2598 = *(undefined4 *)(local_24b8 + uVar33);
                    local_2594 = *(undefined4 *)((long)&local_2578 + uVar33);
                    local_258c = (local_25d8.context)->instID[0];
                    local_2588 = (local_25d8.context)->instPrimID[0];
                    (ray->super_RayK<1>).tfar = *(float *)(local_24a8 + uVar33);
                    local_261c = -1;
                    local_25d8.valid = &local_261c;
                    local_25d8.geometryUserPtr = local_2658->userPtr;
                    local_25d8.ray = (RTCRayN *)ray;
                    local_25d8.hit = (RTCHitN *)&local_25a8;
                    local_25d8.N = 1;
                    local_2608 = auVar73._0_16_;
                    local_2630 = CONCAT44(local_2630._4_4_,(uint)bVar12);
                    local_2618 = auVar37;
                    if (local_2658->intersectionFilterN == (RTCFilterFunctionN)0x0) {
LAB_01f228ce:
                      auVar36 = auVar104._0_16_;
                      if ((local_2640->filter != (RTCFilterFunctionN)0x0) &&
                         (((local_2640->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((local_2658->field_8).field_0x2 & 0x40) != 0)))) {
                        (*local_2640->filter)(&local_25d8);
                        uVar30 = (uint)local_2638;
                        auVar73 = ZEXT1664(local_2608);
                        auVar108 = ZEXT3264(local_2568);
                        auVar107 = ZEXT3264(local_2548);
                        auVar106 = ZEXT3264(local_2528);
                        auVar37 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                        auVar105 = ZEXT1664(auVar37);
                        auVar36 = vxorps_avx512vl(auVar36,auVar36);
                        auVar104 = ZEXT1664(auVar36);
                        ray = local_2650;
                        context = local_2648;
                        pSVar28 = local_2628;
                        bVar12 = (byte)local_2630;
                        if (*local_25d8.valid == 0) goto LAB_01f229ad;
                      }
                      (((Vec3f *)((long)local_25d8.ray + 0x30))->field_0).field_0.x =
                           *(float *)local_25d8.hit;
                      (((Vec3f *)((long)local_25d8.ray + 0x30))->field_0).field_0.y =
                           *(float *)(local_25d8.hit + 4);
                      (((Vec3f *)((long)local_25d8.ray + 0x30))->field_0).field_0.z =
                           *(float *)(local_25d8.hit + 8);
                      *(float *)((long)local_25d8.ray + 0x3c) = *(float *)(local_25d8.hit + 0xc);
                      *(float *)((long)local_25d8.ray + 0x40) = *(float *)(local_25d8.hit + 0x10);
                      *(float *)((long)local_25d8.ray + 0x44) = *(float *)(local_25d8.hit + 0x14);
                      *(float *)((long)local_25d8.ray + 0x48) = *(float *)(local_25d8.hit + 0x18);
                      *(float *)((long)local_25d8.ray + 0x4c) = *(float *)(local_25d8.hit + 0x1c);
                      *(float *)((long)local_25d8.ray + 0x50) = *(float *)(local_25d8.hit + 0x20);
                    }
                    else {
                      (*local_2658->intersectionFilterN)(&local_25d8);
                      uVar30 = (uint)local_2638;
                      auVar73 = ZEXT1664(local_2608);
                      auVar108 = ZEXT3264(local_2568);
                      auVar107 = ZEXT3264(local_2548);
                      auVar106 = ZEXT3264(local_2528);
                      auVar37 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
                      auVar105 = ZEXT1664(auVar37);
                      auVar36 = vxorps_avx512vl(auVar36,auVar36);
                      auVar104 = ZEXT1664(auVar36);
                      ray = local_2650;
                      context = local_2648;
                      pSVar28 = local_2628;
                      bVar12 = (byte)local_2630;
                      if (*local_25d8.valid != 0) goto LAB_01f228ce;
LAB_01f229ad:
                      (local_2650->super_RayK<1>).tfar = (float)local_2618._0_4_;
                      ray = local_2650;
                      context = local_2648;
                      pSVar28 = local_2628;
                    }
                    auVar4._0_4_ = (ray->super_RayK<1>).tfar;
                    auVar4._4_4_ = (ray->super_RayK<1>).mask;
                    auVar4._8_4_ = (ray->super_RayK<1>).id;
                    auVar4._12_4_ = (ray->super_RayK<1>).flags;
                    auVar74 = ZEXT1664(auVar4);
                    fVar76 = (ray->super_RayK<1>).tfar;
                    auVar11._4_4_ = fVar76;
                    auVar11._0_4_ = fVar76;
                    auVar11._8_4_ = fVar76;
                    auVar11._12_4_ = fVar76;
                    uVar79 = vcmpps_avx512vl(auVar73._0_16_,auVar11,2);
                    bVar12 = ~(byte)(1 << (uVar30 & 0x1f)) & bVar12 & (byte)uVar79;
                    uVar13 = vextractps_avx(auVar4,1);
                  }
                  if (bVar12 == 0) break;
                  auVar72._8_4_ = 0x7f800000;
                  auVar72._0_8_ = 0x7f8000007f800000;
                  auVar72._12_4_ = 0x7f800000;
                  auVar36 = vblendmps_avx512vl(auVar72,auVar73._0_16_);
                  auVar58._0_4_ =
                       (uint)(bVar12 & 1) * auVar36._0_4_ | (uint)!(bool)(bVar12 & 1) * 0x7f800000;
                  bVar6 = (bool)(bVar12 >> 1 & 1);
                  auVar58._4_4_ = (uint)bVar6 * auVar36._4_4_ | (uint)!bVar6 * 0x7f800000;
                  bVar6 = (bool)(bVar12 >> 2 & 1);
                  auVar58._8_4_ = (uint)bVar6 * auVar36._8_4_ | (uint)!bVar6 * 0x7f800000;
                  bVar6 = (bool)(bVar12 >> 3 & 1);
                  auVar58._12_4_ = (uint)bVar6 * auVar36._12_4_ | (uint)!bVar6 * 0x7f800000;
                  auVar36 = vshufps_avx(auVar58,auVar58,0xb1);
                  auVar36 = vminps_avx(auVar36,auVar58);
                  auVar37 = vshufpd_avx(auVar36,auVar36,1);
                  auVar36 = vminps_avx(auVar37,auVar36);
                  uVar79 = vcmpps_avx512vl(auVar58,auVar36,0);
                  bVar17 = (byte)uVar79 & bVar12;
                } while( true );
              }
            }
            local_25e0 = local_25e0 + 1;
          } while (local_25e0 != local_25e8);
        }
        fVar76 = (ray->super_RayK<1>).tfar;
        auVar73 = ZEXT3264(CONCAT428(fVar76,CONCAT424(fVar76,CONCAT420(fVar76,CONCAT416(fVar76,
                                                  CONCAT412(fVar76,CONCAT48(fVar76,CONCAT44(fVar76,
                                                  fVar76))))))));
        auVar74 = ZEXT464((uint)(ray->super_RayK<1>).tfar);
        auVar91 = ZEXT3264(local_23b8);
        auVar92 = ZEXT3264(local_23d8);
        auVar99 = ZEXT3264(local_2418);
        auVar100 = ZEXT3264(local_2438);
        auVar101 = ZEXT3264(local_2458);
        auVar102 = ZEXT3264(_DAT_01fe9900);
        auVar59 = vbroadcastss_avx512vl(ZEXT416(0xfffffff8));
        auVar103 = ZEXT3264(auVar59);
        lVar24 = local_25f8;
        fVar76 = local_2398;
        fVar84 = fStack_2394;
        fVar85 = fStack_2390;
        fVar86 = fStack_238c;
        fVar87 = fStack_2388;
        fVar88 = fStack_2384;
        fVar89 = fStack_2380;
        fVar68 = local_23f8;
        fVar93 = fStack_23f4;
        fVar94 = fStack_23f0;
        fVar95 = fStack_23ec;
        fVar96 = fStack_23e8;
        fVar97 = fStack_23e4;
        fVar98 = fStack_23e0;
      }
LAB_01f22afd:
    } while (local_25f0 != &local_2378);
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::intersect(const Accel::Intersectors* __restrict__ This,
                                                                              RayHit& __restrict__ ray,
                                                                              RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      StackItemT<NodeRef> stack[stackSize];    // stack of nodes
      StackItemT<NodeRef>* stackPtr = stack+1; // current stack pointer
      StackItemT<NodeRef>* stackEnd = stack+stackSize;
      stack[0].ptr  = bvh->root;
      stack[0].dist = neg_inf;
      
      if (bvh->root == BVH::emptyNode)
        return;
      
      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif
      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = NodeRef(stackPtr->ptr);

        /* if popped node is too far, pop next one */
        if (unlikely(*(float*)&stackPtr->dist > ray.tfar))
          continue;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(normal.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(normal.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseClosestHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(normal.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        PrimitiveIntersector1::intersect(This, pre, ray, context, prim, num, tray, lazy_node);
        tray.tfar = ray.tfar;

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          stackPtr->ptr = lazy_node;
          stackPtr->dist = neg_inf;
          stackPtr++;
        }
      }
    }